

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void long_filename_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  char *__format;
  int iVar7;
  bool bVar8;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  void *rvalue;
  size_t rvalue_len;
  fdb_kvs_config local_33a0;
  char keyword [63];
  timeval __test_begin;
  fdb_config local_3330;
  char key [256];
  char value [256];
  char filename [4096];
  char temp [4096];
  char cmd [4096];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  builtin_strncpy(keyword + 0x20,"6789ABCDEFGHIJKLMNOPQRSTUVWXYZ",0x1f);
  builtin_strncpy(keyword + 0x10,"qrstuvwxyz012345",0x10);
  builtin_strncpy(keyword,"abcdefghijklmnop",0x10);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  sprintf(temp,"/%s",keyword);
  strcpy(filename,keyword);
  while( true ) {
    sVar3 = strlen(filename);
    if (0x3ff < sVar3) break;
    strcat(filename,keyword);
  }
  fVar2 = fdb_open(&dbfile,filename,&local_3330);
  if (fVar2 != FDB_RESULT_TOO_LONG_FILENAME) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,900);
    long_filename_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_TOO_LONG_FILENAME",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,900,"void long_filename_test()");
  }
  sprintf(cmd,"rm -rf  %s",keyword);
  system(cmd);
  for (iVar5 = 0; iVar5 != 0xf; iVar5 = iVar5 + 1) {
    sprintf(cmd,"mkdir  %s",keyword);
    iVar7 = iVar5;
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      strcat(cmd,temp);
    }
    sVar3 = strlen(cmd);
    if (0x400 < sVar3) break;
    system(cmd);
  }
  strcpy(filename,keyword);
  iVar7 = 1;
  if (1 < iVar5) {
    iVar7 = iVar5;
  }
  while (iVar7 = iVar7 + -1, iVar7 != 0) {
    strcat(filename,temp);
  }
  sVar3 = strlen(filename);
  builtin_strncpy(filename + sVar3,"/dbfile",8);
  fVar2 = fdb_open(&dbfile,filename,&local_3330);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x39c);
    long_filename_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x39c,"void long_filename_test()");
  }
  fVar2 = fdb_kvs_open_default(dbfile,&db,&local_33a0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x39e);
    long_filename_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x39e,"void long_filename_test()");
  }
  uVar6 = 0;
  while (uVar6 != 1000) {
    sprintf(key,"key%08d",(ulong)uVar6);
    sprintf(value,"value%08d",(ulong)uVar6);
    pfVar1 = db;
    sVar3 = strlen(key);
    sVar4 = strlen(value);
    fVar2 = fdb_set_kv(pfVar1,key,sVar3 + 1,value,sVar4 + 1);
    uVar6 = uVar6 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x3a5);
      long_filename_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x3a5,"void long_filename_test()");
    }
  }
  fVar2 = fdb_commit(dbfile,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x3a8);
    long_filename_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x3a8,"void long_filename_test()");
  }
  for (uVar6 = 0; uVar6 != 1000; uVar6 = uVar6 + 1) {
    sprintf(key,"key%08d",(ulong)uVar6);
    pfVar1 = db;
    sVar3 = strlen(key);
    fVar2 = fdb_get_kv(pfVar1,key,sVar3 + 1,&rvalue,&rvalue_len);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x3ae);
      long_filename_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x3ae,"void long_filename_test()");
    }
    fdb_free_block(rvalue);
  }
  fVar2 = fdb_kvs_close(db);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x3b3);
    long_filename_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x3b3,"void long_filename_test()");
  }
  fVar2 = fdb_close(dbfile);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      sprintf(cmd,"rm -rf  %s",keyword);
      system(cmd);
      memleak_end();
      __format = "%s PASSED\n";
      if (long_filename_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"long filename test");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x3b7);
    long_filename_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x3b7,"void long_filename_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x3b5);
  long_filename_test()::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x3b5,"void long_filename_test()");
}

Assistant:

void long_filename_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int n=15, m=1000;
    char keyword[] = "abcdefghijklmnopqrstuvwxyz0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    char filename[4096], cmd[4096], temp[4096];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s;
    size_t rvalue_len;
    char key[256], value[256];
    void *rvalue;

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    sprintf(temp, SHELL_DMT"%s", keyword);

    // filename longer than 1024 bytes
    sprintf(filename, "%s", keyword);
    while (strlen(filename) < 1024) {
        strcat(filename, keyword);
    }
    s = fdb_open(&dbfile, filename, &config);
    TEST_CHK(s == FDB_RESULT_TOO_LONG_FILENAME);

    // make nested directories for long path
    // but shorter than 1024 bytes (windows: 256 bytes)
    sprintf(cmd, SHELL_RMDIR" %s", keyword);
    r = system(cmd);
    (void)r;
    for (i=0;i<n;++i) {
        sprintf(cmd, SHELL_MKDIR" %s", keyword);
        for (j=0;j<i;++j){
            strcat(cmd, temp);
        }
        if (strlen(cmd) > SHELL_MAX_PATHLEN) break;
        r = system(cmd);
        (void)r;
    }

    // create DB file
    sprintf(filename, "%s", keyword);
    for (j=0;j<i-1;++j){
        strcat(filename, temp);
    }
    strcat(filename, SHELL_DMT"dbfile");
    s = fdb_open(&dbfile, filename, &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // === write ===
    for (i=0;i<m;++i){
        sprintf(key, "key%08d", i);
        sprintf(value, "value%08d", i);
        s = fdb_set_kv(db, key, strlen(key)+1, value, strlen(value)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // === read ===
    for (i=0;i<m;++i){
        sprintf(key, "key%08d", i);
        s = fdb_get_kv(db, key, strlen(key)+1, &rvalue, &rvalue_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_free_block(rvalue);
    }

    s = fdb_kvs_close(db);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    sprintf(cmd, SHELL_RMDIR" %s", keyword);
    r = system(cmd);
    (void)r;

    memleak_end();
    TEST_RESULT("long filename test");
}